

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedDeepImageChannel<unsigned_int>::moveSampleList
          (TypedDeepImageChannel<unsigned_int> *this,size_t i,uint oldNumSamples,uint newNumSamples,
          size_t newSampleListPosition)

{
  uint *puVar1;
  uint **ppuVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  
  ppuVar2 = this->_sampleListPointers;
  puVar3 = this->_sampleBuffer;
  puVar4 = ppuVar2[i];
  puVar1 = puVar3 + newSampleListPosition;
  if (newNumSamples < oldNumSamples) {
    if (newNumSamples != 0) {
      uVar5 = 0;
      do {
        puVar1[uVar5] = puVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (newNumSamples != uVar5);
    }
  }
  else {
    if (oldNumSamples != 0) {
      uVar5 = 0;
      do {
        puVar1[uVar5] = puVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (oldNumSamples != uVar5);
    }
    if (oldNumSamples < newNumSamples) {
      memset(puVar3 + oldNumSamples + newSampleListPosition,0,
             (ulong)(~oldNumSamples + newNumSamples) * 4 + 4);
    }
  }
  ppuVar2[i] = puVar1;
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSampleList (
    size_t       i,
    unsigned int oldNumSamples,
    unsigned int newNumSamples,
    size_t       newSampleListPosition)
{
    //
    // Resize the sample list for a single pixel and move it to a new
    // position in the sample buffer for this channel.
    //
    // i                        The position of the affected pixel in
    //                          the channel's _sampleListPointers.
    //
    // oldNumSamples            Original number of samples in sample list.
    //
    // newNumSamples            New number of samples in the sample list.
    //                          If the new number of samples is larger than
    //                          the old number of samples for a given sample
    //                          list, then the end of the new sample list
    //                          is filled with zeroes.  If the new number of
    //                          samples is smaller than the old one, then
    //                          samples at the end of the old sample list
    //                          are discarded.
    //
    // newSampleListPosition    The new position of the sample list in the
    //                          sample buffer.
    //

    T* oldSampleList = _sampleListPointers[i];
    T* newSampleList = _sampleBuffer + newSampleListPosition;

    if (oldNumSamples > newNumSamples)
    {
        for (unsigned int j = 0; j < newNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];
    }
    else
    {
        for (unsigned int j = 0; j < oldNumSamples; ++j)
            newSampleList[j] = oldSampleList[j];

        for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
            newSampleList[j] = 0;
    }

    _sampleListPointers[i] = newSampleList;
}